

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_decomp.c
# Opt level: O3

void invert_L8(uchar *L,int n)

{
  byte bVar1;
  char cVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  uchar *puVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  byte local_58;
  ulong local_50;
  ulong local_48;
  
  if (1 < n) {
    uVar3 = (ulong)((uint)n >> 3);
    uVar13 = (ulong)(uint)n;
    local_48 = (ulong)(((uint)n >> 3) * 2);
    local_50 = 2;
    uVar4 = 1;
    uVar12 = uVar3;
    do {
      uVar5 = uVar4 + 1;
      if (uVar5 < uVar13) {
        uVar9 = (uint)uVar4 - 1;
        uVar10 = (ulong)(uVar9 >> 3);
        cVar2 = (char)(0x80 >> ((byte)uVar9 & 7));
        local_58 = cVar2 - 1;
        uVar6 = local_50;
        uVar11 = local_48;
        do {
          bVar1 = -((L[(ulong)((uint)((int)uVar6 * n) >> 3) + (uVar4 >> 3 & 0x1fffffff)] >>
                     (~(uint)uVar4 & 7) & 1) != 0);
          if (8 < uVar4) {
            lVar7 = 0;
            puVar8 = L;
            do {
              puVar8[uVar11] = puVar8[uVar11] ^ puVar8[uVar12] & bVar1;
              lVar7 = lVar7 + 8;
              puVar8 = puVar8 + 1;
            } while (lVar7 <= (long)(uVar4 - 9));
          }
          L[uVar6 * uVar3 + uVar10] =
               (bVar1 & L[uVar10 + uVar4 * uVar3] ^ L[uVar6 * uVar3 + uVar10]) & -cVar2 |
               L[uVar6 * uVar3 + uVar10] & local_58;
          uVar6 = uVar6 + 1;
          uVar11 = uVar11 + uVar3;
        } while (uVar6 != uVar13);
      }
      local_50 = local_50 + 1;
      local_48 = local_48 + uVar3;
      uVar12 = uVar12 + uVar3;
      uVar4 = uVar5;
    } while (uVar5 != uVar13);
  }
  return;
}

Assistant:

void invert_L8(unsigned char *L, int n)
{
  /*
   * inversion == forward substitution
   *
   * For all columns c = 1 ... n-1
   *   For all rows c+1 ... n-1
   *     add (row c) * (leading (c'th) element of row r) to row r.
   *       only do it for the k elements k = 0 ... c-1
   */

  for(int c = 1; c <= n-1; c++)
  {
    /*
     * Basically:
     *      copy elements 0 to c-1  from c'th row to r'th row iff leading element of row r is 1
     */
    for(int r = c+1; r <= n-1; r++)
    {
      /*
       * first copy all "full bytes" at the left
       */
      unsigned char mask_rc = 0x00 - ((L[r*n/8 + (c/8)] >> (7 - (c % 8))) & 1); // mask for the element U(r,c)
      for(int k = 0; k <= c-1 - 8; k += 8)
      {
        L[r*(n/8) + k/8] ^= mask_rc & L[c*(n/8) + k/8];
      }

      /*
       * then handle the right-most "partial byte"
       */
      int k = c-1;
      unsigned char mask_prepending = ((unsigned char) (0x80 >> (k % 8)) - 1);

      unsigned char tmp_rk = L[r*(n/8) + k/8] & mask_prepending; // store the right side of the splitted byte in tmp
      L[r*(n/8) + k/8]  ^= (mask_rc & L[c*(n/8) + k/8]);

      // restore the right bits: first set bits 0, then 'or' tmp
      L[r*(n/8) + k/8] &= ~mask_prepending;
      L[r*(n/8) + k/8] |= tmp_rk;
    }
  }
}